

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O1

void * vmd_pool_alloc(vmd_pool_t *pool,size_t s)

{
  vmd_pool_chunk_t *pvVar1;
  vmd_pool_chunk_t *pvVar2;
  size_t sVar3;
  
  pvVar1 = pool->chunk;
  if ((pvVar1 == (vmd_pool_chunk_t *)0x0) || (pvVar1->free < s)) {
    sVar3 = 0x200;
    if (0x200 < s) {
      sVar3 = s;
    }
    pvVar2 = (vmd_pool_chunk_t *)malloc(sVar3 + 0x18);
    pvVar2->size = sVar3;
    pvVar2->free = sVar3;
    pvVar2->next = pvVar1;
    pool->chunk = pvVar2;
  }
  pvVar1 = pool->chunk;
  sVar3 = pvVar1->free;
  pvVar1->free = sVar3 - s;
  return (void *)((long)pvVar1 + (pvVar1->size - sVar3) + 0x18);
}

Assistant:

void *
pool_alloc(pool_t *pool, size_t s)
{
	if (pool->chunk == NULL || pool->chunk->free < s ) {
		pool_chunk_t *chunk = alloc_chunk(MAX(512, s));
		chunk->next = pool->chunk;
		pool->chunk = chunk;
	}

	void *ret = pool->chunk->data + pool->chunk->size - pool->chunk->free;
	pool->chunk->free -= s;
	return ret;
}